

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# php_generator.cc
# Opt level: O0

string * google::protobuf::compiler::php::BinaryToHex(string *binary)

{
  ulong uVar1;
  ulong uVar2;
  char *pcVar3;
  undefined1 *puVar4;
  ulong in_RSI;
  string *in_RDI;
  char *append_ptr;
  uchar symbol [16];
  size_t i;
  string *dest;
  undefined1 *local_50;
  undefined8 local_38;
  undefined8 uStack_30;
  ulong local_20;
  undefined1 local_11;
  ulong local_10;
  
  local_11 = 0;
  local_10 = in_RSI;
  std::__cxx11::string::string((string *)in_RDI);
  local_38 = 0x3736353433323130;
  uStack_30 = 0x6665646362613938;
  std::__cxx11::string::size();
  std::__cxx11::string::resize((ulong)in_RDI);
  local_50 = (undefined1 *)std::__cxx11::string::operator[]((ulong)in_RDI);
  for (local_20 = 0; uVar1 = local_20, uVar2 = std::__cxx11::string::size(), uVar1 < uVar2;
      local_20 = local_20 + 1) {
    pcVar3 = (char *)std::__cxx11::string::operator[](local_10);
    puVar4 = local_50 + 1;
    *local_50 = *(undefined1 *)((long)&local_38 + (long)((int)((int)*pcVar3 & 0xf0U) >> 4));
    pcVar3 = (char *)std::__cxx11::string::operator[](local_10);
    local_50 = local_50 + 2;
    *puVar4 = *(undefined1 *)((long)&local_38 + (long)(int)((int)*pcVar3 & 0xf));
  }
  return in_RDI;
}

Assistant:

std::string BinaryToHex(const string& binary) {
  string dest;
  size_t i;
  unsigned char symbol[16] = {
    '0', '1', '2', '3',
    '4', '5', '6', '7',
    '8', '9', 'a', 'b',
    'c', 'd', 'e', 'f',
  };

  dest.resize(binary.size() * 2);
  char* append_ptr = &dest[0];

  for (i = 0; i < binary.size(); i++) {
    *append_ptr++ = symbol[(binary[i] & 0xf0) >> 4];
    *append_ptr++ = symbol[binary[i] & 0x0f];
  }

  return dest;
}